

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageRead(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  DiagnosticStream *pDVar4;
  spv_const_context psVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar6;
  Function *pFVar7;
  char *__rhs;
  uint local_193c;
  undefined1 local_1910 [4];
  spv_result_t result_1;
  DiagnosticStream local_1738;
  uint32_t local_1560;
  uint local_155c;
  uint32_t actual_coord_size;
  uint32_t min_coord_size;
  uint32_t local_1380;
  spv_result_t local_137c;
  uint32_t coord_type;
  spv_result_t result;
  DiagnosticStream local_1370;
  uint32_t local_1194;
  char *pcStack_1190;
  uint32_t result_component_type;
  DiagnosticStream local_1188;
  allocator<char> local_fa9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f88;
  DiagnosticStream local_f68;
  DiagnosticStream local_d90;
  uint local_bb4;
  char *pcStack_bb0;
  uint32_t mask;
  DiagnosticStream local_ba8;
  char *local_9d0;
  DiagnosticStream local_9c8;
  DiagnosticStream local_7f0;
  undefined1 local_618 [8];
  ImageTypeInfo info;
  char *pcStack_418;
  uint32_t image_type;
  string local_410;
  DiagnosticStream local_3f0;
  spv_target_env local_214;
  char *pcStack_210;
  spv_target_env target_env;
  DiagnosticStream local_208;
  spv_result_t local_2c;
  uint32_t local_28;
  spv_result_t error;
  uint32_t actual_result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _actual_result_type = inst;
  inst_local = (Instruction *)_;
  error = val::Instruction::opcode(inst);
  local_28 = 0;
  local_2c = GetActualResultType((ValidationState_t *)inst_local,_actual_result_type,&local_28);
  __local._4_4_ = local_2c;
  if (local_2c == SPV_SUCCESS) {
    bVar1 = ValidationState_t::IsIntScalarOrVectorType((ValidationState_t *)inst_local,local_28);
    if ((bVar1) ||
       (bVar1 = ValidationState_t::IsFloatScalarOrVectorType
                          ((ValidationState_t *)inst_local,local_28), bVar1)) {
      psVar5 = ValidationState_t::context((ValidationState_t *)inst_local);
      local_214 = psVar5->target_env;
      bVar1 = spvIsVulkanEnv(local_214);
      if ((bVar1) &&
         (uVar2 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_28),
         uVar2 != 4)) {
        ValidationState_t::diag
                  (&local_3f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                   _actual_result_type);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_410,(ValidationState_t *)inst_local,0x12ac,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_3f0,&local_410);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [10])"Expected ");
        pcStack_418 = GetActualResultTypeStr(error);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&stack0xfffffffffffffbe8);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [22])" to have 4 components");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_410);
        DiagnosticStream::~DiagnosticStream(&local_3f0);
      }
      else {
        uVar2 = ValidationState_t::GetOperandTypeId
                          ((ValidationState_t *)inst_local,_actual_result_type,2);
        OVar3 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,uVar2);
        if (OVar3 == OpTypeImage) {
          ImageTypeInfo::ImageTypeInfo((ImageTypeInfo *)local_618);
          bVar1 = GetImageTypeInfo((ValidationState_t *)inst_local,uVar2,(ImageTypeInfo *)local_618)
          ;
          if (bVar1) {
            bVar1 = spvIsOpenCLEnv(local_214);
            if (bVar1) {
              if (info.sampled_type == 0) {
                uVar2 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_28);
                if (uVar2 != 4) {
                  ValidationState_t::diag
                            (&local_ba8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                             _actual_result_type);
                  pDVar4 = DiagnosticStream::operator<<(&local_ba8,(char (*) [10])"Expected ");
                  pcStack_bb0 = GetActualResultTypeStr(error);
                  pDVar4 = DiagnosticStream::operator<<(pDVar4,&stack0xfffffffffffff450);
                  pDVar4 = DiagnosticStream::operator<<
                                     (pDVar4,(char (*) [22])" to have 4 components");
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                  DiagnosticStream::~DiagnosticStream(&local_ba8);
                  return __local._4_4_;
                }
              }
              else {
                bVar1 = ValidationState_t::IsFloatScalarType
                                  ((ValidationState_t *)inst_local,local_28);
                if (!bVar1) {
                  ValidationState_t::diag
                            (&local_9c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                             _actual_result_type);
                  pDVar4 = DiagnosticStream::operator<<(&local_9c8,(char (*) [10])"Expected ");
                  local_9d0 = GetActualResultTypeStr(error);
                  pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_9d0);
                  pDVar4 = DiagnosticStream::operator<<
                                     (pDVar4,(char (*) [59])
                                             " from a depth image read to result in a scalar float value"
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                  DiagnosticStream::~DiagnosticStream(&local_9c8);
                  return __local._4_4_;
                }
              }
              this_00 = val::Instruction::words(_actual_result_type);
              sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
              if (sVar6 < 6) {
                local_193c = 0;
              }
              else {
                local_193c = val::Instruction::word(_actual_result_type,5);
              }
              local_bb4 = local_193c;
              if ((local_193c & 8) != 0) {
                ValidationState_t::diag
                          (&local_d90,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _actual_result_type);
                pDVar4 = DiagnosticStream::operator<<
                                   (&local_d90,
                                    (char (*) [39])"ConstOffset image operand not allowed ");
                pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [27])0xf39502);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                DiagnosticStream::~DiagnosticStream(&local_d90);
                return __local._4_4_;
              }
            }
            this = inst_local;
            if (local_618._4_4_ == DimSubpassData) {
              if (error == 0x140) {
                ValidationState_t::diag
                          (&local_f68,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _actual_result_type);
                pDVar4 = DiagnosticStream::operator<<
                                   (&local_f68,
                                    (char (*) [58])
                                    "Image Dim SubpassData cannot be used with ImageSparseRead");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                DiagnosticStream::~DiagnosticStream(&local_f68);
                return __local._4_4_;
              }
              pFVar7 = val::Instruction::function(_actual_result_type);
              uVar2 = val::Function::id(pFVar7);
              pFVar7 = ValidationState_t::function((ValidationState_t *)this,uVar2);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_fa8,"Dim SubpassData requires Fragment execution model: ",
                         &local_fa9);
              __rhs = spvOpcodeString(error);
              std::operator+(&local_f88,&local_fa8,__rhs);
              val::Function::RegisterExecutionModelLimitation
                        (pFVar7,ExecutionModelFragment,&local_f88);
              std::__cxx11::string::~string((string *)&local_f88);
              std::__cxx11::string::~string((string *)&local_fa8);
              std::allocator<char>::~allocator(&local_fa9);
            }
            if (local_618._4_4_ == DimTileImageDataEXT) {
              ValidationState_t::diag
                        (&local_1188,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                         _actual_result_type);
              pDVar4 = DiagnosticStream::operator<<
                                 (&local_1188,
                                  (char (*) [48])"Image Dim TileImageDataEXT cannot be used with ");
              pcStack_1190 = spvOpcodeString(error);
              pDVar4 = DiagnosticStream::operator<<(pDVar4,&stack0xffffffffffffee70);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
              DiagnosticStream::~DiagnosticStream(&local_1188);
            }
            else {
              OVar3 = ValidationState_t::GetIdOpcode
                                ((ValidationState_t *)inst_local,local_618._0_4_);
              if ((OVar3 == OpTypeVoid) ||
                 (local_1194 = ValidationState_t::GetComponentType
                                         ((ValidationState_t *)inst_local,local_28),
                 local_1194 == local_618._0_4_)) {
                local_137c = ValidateImageReadWrite
                                       ((ValidationState_t *)inst_local,_actual_result_type,
                                        (ImageTypeInfo *)local_618);
                __local._4_4_ = local_137c;
                if (local_137c == SPV_SUCCESS) {
                  local_1380 = ValidationState_t::GetOperandTypeId
                                         ((ValidationState_t *)inst_local,_actual_result_type,3);
                  bVar1 = ValidationState_t::IsIntScalarOrVectorType
                                    ((ValidationState_t *)inst_local,local_1380);
                  if (bVar1) {
                    local_155c = GetMinCoordSize(error,(ImageTypeInfo *)local_618);
                    local_1560 = ValidationState_t::GetDimension
                                           ((ValidationState_t *)inst_local,local_1380);
                    if (local_1560 < local_155c) {
                      ValidationState_t::diag
                                (&local_1738,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                                 _actual_result_type);
                      pDVar4 = DiagnosticStream::operator<<
                                         (&local_1738,
                                          (char (*) [38])"Expected Coordinate to have at least ");
                      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_155c);
                      pDVar4 = DiagnosticStream::operator<<
                                         (pDVar4,(char (*) [29])" components, but given only ");
                      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_1560);
                      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                      DiagnosticStream::~DiagnosticStream(&local_1738);
                    }
                    else {
                      psVar5 = ValidationState_t::context((ValidationState_t *)inst_local);
                      bVar1 = spvIsVulkanEnv(psVar5->target_env);
                      if ((((!bVar1) || (info.multisampled != 0)) ||
                          (local_618._4_4_ == DimSubpassData)) ||
                         (bVar1 = ValidationState_t::HasCapability
                                            ((ValidationState_t *)inst_local,
                                             CapabilityStorageImageReadWithoutFormat), bVar1)) {
                        __local._4_4_ =
                             ValidateImageOperands
                                       ((ValidationState_t *)inst_local,_actual_result_type,
                                        (ImageTypeInfo *)local_618,6);
                        if (__local._4_4_ == SPV_SUCCESS) {
                          __local._4_4_ = SPV_SUCCESS;
                        }
                      }
                      else {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_1910,(ValidationState_t *)inst_local,
                                   SPV_ERROR_INVALID_DATA,_actual_result_type);
                        pDVar4 = DiagnosticStream::operator<<
                                           ((DiagnosticStream *)local_1910,
                                            (char (*) [57])
                                            "Capability StorageImageReadWithoutFormat is required to "
                                           );
                        pDVar4 = DiagnosticStream::operator<<
                                           (pDVar4,(char (*) [19])"read storage image");
                        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1910);
                      }
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&actual_coord_size,
                               (ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                               _actual_result_type);
                    pDVar4 = DiagnosticStream::operator<<
                                       ((DiagnosticStream *)&actual_coord_size,
                                        (char (*) [47])
                                        "Expected Coordinate to be int scalar or vector");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&actual_coord_size);
                  }
                }
              }
              else {
                ValidationState_t::diag
                          (&local_1370,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _actual_result_type);
                pDVar4 = DiagnosticStream::operator<<
                                   (&local_1370,
                                    (char (*) [49])
                                    "Expected Image \'Sampled Type\' to be the same as ");
                _coord_type = GetActualResultTypeStr(error);
                pDVar4 = DiagnosticStream::operator<<(pDVar4,(char **)&coord_type);
                pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [12])0xf3b611);
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                DiagnosticStream::~DiagnosticStream(&local_1370);
              }
            }
          }
          else {
            ValidationState_t::diag
                      (&local_7f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _actual_result_type);
            pDVar4 = DiagnosticStream::operator<<
                               (&local_7f0,(char (*) [30])"Corrupt image type definition");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_7f0);
          }
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&info.format,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_DATA,_actual_result_type);
          pDVar4 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&info.format,
                              (char (*) [41])"Expected Image to be of type OpTypeImage");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&info.format);
        }
      }
    }
    else {
      ValidationState_t::diag
                (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 _actual_result_type);
      pDVar4 = DiagnosticStream::operator<<(&local_208,(char (*) [10])"Expected ");
      pcStack_210 = GetActualResultTypeStr(error);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&stack0xfffffffffffffdf0);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [42])" to be int or float scalar or vector type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageRead(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  uint32_t actual_result_type = 0;
  if (spv_result_t error = GetActualResultType(_, inst, &actual_result_type)) {
    return error;
  }

  if (!_.IsIntScalarOrVectorType(actual_result_type) &&
      !_.IsFloatScalarOrVectorType(actual_result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected " << GetActualResultTypeStr(opcode)
           << " to be int or float scalar or vector type";
  }

  const auto target_env = _.context()->target_env;
  // Vulkan requires the result to be a 4-element int or float
  // vector.
  if (spvIsVulkanEnv(target_env)) {
    if (_.GetDimension(actual_result_type) != 4) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4780) << "Expected "
             << GetActualResultTypeStr(opcode) << " to have 4 components";
    }
  }  // Check OpenCL below, after we get the image info.

  const uint32_t image_type = _.GetOperandTypeId(inst, 2);
  if (_.GetIdOpcode(image_type) != spv::Op::OpTypeImage) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image to be of type OpTypeImage";
  }

  ImageTypeInfo info;
  if (!GetImageTypeInfo(_, image_type, &info)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Corrupt image type definition";
  }

  if (spvIsOpenCLEnv(target_env)) {
    // In OpenCL, a read from a depth image returns a scalar float. In other
    // cases, the result is always a 4-element vector.
    // https://www.khronos.org/registry/OpenCL/specs/3.0-unified/html/OpenCL_Env.html#_data_format_for_reading_and_writing_images
    // https://www.khronos.org/registry/OpenCL/specs/3.0-unified/html/OpenCL_C.html#image-read-and-write-functions
    // The builtins for reading depth images are:
    //   float read_imagef(aQual image2d_depth_t image, int2 coord)
    //   float read_imagef(aQual image2d_array_depth_t image, int4 coord)
    if (info.depth) {
      if (!_.IsFloatScalarType(actual_result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected " << GetActualResultTypeStr(opcode)
               << " from a depth image read to result in a scalar float value";
      }
    } else {
      if (_.GetDimension(actual_result_type) != 4) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected " << GetActualResultTypeStr(opcode)
               << " to have 4 components";
      }
    }

    const uint32_t mask = inst->words().size() <= 5 ? 0 : inst->word(5);
    if (mask & uint32_t(spv::ImageOperandsMask::ConstOffset)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ConstOffset image operand not allowed "
             << "in the OpenCL environment.";
    }
  }

  if (info.dim == spv::Dim::SubpassData) {
    if (opcode == spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Dim SubpassData cannot be used with ImageSparseRead";
    }

    _.function(inst->function()->id())
        ->RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            std::string("Dim SubpassData requires Fragment execution model: ") +
                spvOpcodeString(opcode));
  }

  if (info.dim == spv::Dim::TileImageDataEXT) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Dim TileImageDataEXT cannot be used with "
           << spvOpcodeString(opcode);
  }

  if (_.GetIdOpcode(info.sampled_type) != spv::Op::OpTypeVoid) {
    const uint32_t result_component_type =
        _.GetComponentType(actual_result_type);
    if (result_component_type != info.sampled_type) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image 'Sampled Type' to be the same as "
             << GetActualResultTypeStr(opcode) << " components";
    }
  }

  if (spv_result_t result = ValidateImageReadWrite(_, inst, info))
    return result;

  const uint32_t coord_type = _.GetOperandTypeId(inst, 3);
  if (!_.IsIntScalarOrVectorType(coord_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Coordinate to be int scalar or vector";
  }

  const uint32_t min_coord_size = GetMinCoordSize(opcode, info);
  const uint32_t actual_coord_size = _.GetDimension(coord_type);
  if (min_coord_size > actual_coord_size) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Coordinate to have at least " << min_coord_size
           << " components, but given only " << actual_coord_size;
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (info.format == spv::ImageFormat::Unknown &&
        info.dim != spv::Dim::SubpassData &&
        !_.HasCapability(spv::Capability::StorageImageReadWithoutFormat)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability StorageImageReadWithoutFormat is required to "
             << "read storage image";
    }
  }

  if (spv_result_t result =
          ValidateImageOperands(_, inst, info, /* word_index = */ 6))
    return result;

  return SPV_SUCCESS;
}